

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::View(View *this,View *view,bool new_OID)

{
  uint64_t uVar1;
  bool new_OID_local;
  View *view_local;
  View *this_local;
  
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_002ed5f8;
  core::P<r_exec::Controller>::P(&this->controller,(Controller *)0x0);
  std::mutex::mutex(&this->m_groupMutex);
  core::P<r_code::Code>::operator=(&(this->super_View).object,&(view->super_View).object);
  memcpy(&(this->super_View).field_0x28,&(view->super_View).field_0x28,0x34);
  (this->super_View).references[0] = (view->super_View).references[0];
  (this->super_View).references[1] = (view->super_View).references[1];
  if (new_OID) {
    uVar1 = GetOID();
    *(int *)&(this->super_View).field_0x58 = (int)uVar1;
  }
  core::P<r_exec::Controller>::operator=(&this->controller,(Controller *)0x0);
  reset(this);
  return;
}

Assistant:

View::View(const View *view, bool new_OID): r_code::View(), controller(nullptr)
{
    object = view->object;
    memcpy(_code, view->_code, VIEW_CODE_MAX_SIZE * sizeof(Atom));
    references[0] = view->references[0];
    references[1] = view->references[1];

    if (new_OID) {
        _code[VIEW_OID].atom = GetOID();
    }

    controller = nullptr; // deprecated: controller=view->controller;
    reset();
}